

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

void __thiscall cmServerResponse::cmServerResponse(cmServerResponse *this,cmServerRequest *request)

{
  std::__cxx11::string::string((string *)this,(string *)request);
  std::__cxx11::string::string((string *)&this->Cookie,(string *)&request->Cookie);
  this->m_Payload = PAYLOAD_UNKNOWN;
  (this->m_ErrorMessage)._M_dataplus._M_p = (pointer)&(this->m_ErrorMessage).field_2;
  (this->m_ErrorMessage)._M_string_length = 0;
  (this->m_ErrorMessage).field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&this->m_Data,nullValue);
  return;
}

Assistant:

cmServerResponse::cmServerResponse(const cmServerRequest& request)
  : Type(request.Type)
  , Cookie(request.Cookie)
{
}